

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O1

void google::protobuf::internal::WireFormatLite::WriteBytesMaybeAliased
               (int field_number,string *value,CodedOutputStream *output)

{
  byte *pbVar1;
  pointer data;
  bool bVar2;
  LogMessage *other;
  int iVar3;
  byte *pbVar4;
  uint32 uVar5;
  uint uVar6;
  uint uVar7;
  LogFinisher local_59;
  LogMessage local_58;
  
  uVar7 = field_number * 8 + 2;
  if (output->buffer_size_ < 5) {
    io::CodedOutputStream::WriteVarint32SlowPath(output,uVar7);
  }
  else {
    pbVar1 = output->buffer_;
    pbVar4 = pbVar1;
    uVar5 = uVar7;
    if (0x7f < (uint)(field_number << 3)) {
      do {
        *pbVar4 = (byte)uVar7 | 0x80;
        uVar5 = uVar7 >> 7;
        pbVar4 = pbVar4 + 1;
        bVar2 = 0x3fff < uVar7;
        uVar7 = uVar5;
      } while (bVar2);
    }
    *pbVar4 = (byte)uVar5;
    iVar3 = ((int)pbVar4 - (int)pbVar1) + 1;
    output->buffer_ = output->buffer_ + iVar3;
    output->buffer_size_ = output->buffer_size_ - iVar3;
  }
  if ((value->_M_string_length & 0xffffffff80000000) != 0) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/wire_format_lite.cc"
               ,0x216);
    other = LogMessage::operator<<(&local_58,"CHECK failed: (value.size()) <= (kint32max): ");
    LogFinisher::operator=(&local_59,other);
    LogMessage::~LogMessage(&local_58);
  }
  uVar7 = (uint)value->_M_string_length;
  if (output->buffer_size_ < 5) {
    io::CodedOutputStream::WriteVarint32SlowPath(output,uVar7);
  }
  else {
    pbVar1 = output->buffer_;
    pbVar4 = pbVar1;
    uVar6 = uVar7;
    if (0x7f < uVar7) {
      do {
        *pbVar4 = (byte)uVar7 | 0x80;
        uVar6 = uVar7 >> 7;
        pbVar4 = pbVar4 + 1;
        bVar2 = 0x3fff < uVar7;
        uVar7 = uVar6;
      } while (bVar2);
    }
    *pbVar4 = (byte)uVar6;
    iVar3 = ((int)pbVar4 - (int)pbVar1) + 1;
    output->buffer_ = output->buffer_ + iVar3;
    output->buffer_size_ = output->buffer_size_ - iVar3;
  }
  data = (value->_M_dataplus)._M_p;
  iVar3 = (int)value->_M_string_length;
  if (output->aliasing_enabled_ == true) {
    io::CodedOutputStream::WriteAliasedRaw(output,data,iVar3);
  }
  else {
    io::CodedOutputStream::WriteRaw(output,data,iVar3);
  }
  return;
}

Assistant:

void WireFormatLite::WriteBytesMaybeAliased(
    int field_number, const string& value,
    io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_LENGTH_DELIMITED, output);
  GOOGLE_CHECK_LE(value.size(), kint32max);
  output->WriteVarint32(value.size());
  output->WriteRawMaybeAliased(value.data(), value.size());
}